

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalDeclarationStatement.h
# Opt level: O3

void __thiscall
LocalDeclarationStatement::LocalDeclarationStatement
          (LocalDeclarationStatement *this,Identifier *identifier,bool constant,
          ptr<Expression> *expression)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR_execute_0012f130;
  paVar1 = &(this->identifier).field_2;
  (this->identifier)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (identifier->_M_dataplus)._M_p;
  paVar2 = &identifier->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&identifier->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->identifier).field_2 + 8) = uVar5;
  }
  else {
    (this->identifier)._M_dataplus._M_p = pcVar3;
    (this->identifier).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->identifier)._M_string_length = identifier->_M_string_length;
  (identifier->_M_dataplus)._M_p = (pointer)paVar2;
  identifier->_M_string_length = 0;
  (identifier->field_2)._M_local_buf[0] = '\0';
  this->constant = constant;
  (this->expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (expression->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var4 = (expression->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded != '\0') {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      return;
    }
    LOCK();
    p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

LocalDeclarationStatement(Identifier identifier, bool constant, ptr<Expression> expression)
        : identifier(std::move(identifier)), constant(constant), expression(expression) { }